

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Vec_WrdDoubleSimInfo(Vec_Wrd_t *p,int nObjs)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  int local_24;
  int nWords;
  int i;
  word *pArray;
  int nObjs_local;
  Vec_Wrd_t *p_local;
  
  iVar1 = Vec_WrdSize(p);
  pwVar3 = (word *)calloc((long)(iVar1 << 1),8);
  iVar1 = Vec_WrdSize(p);
  iVar1 = iVar1 / nObjs;
  iVar2 = Vec_WrdSize(p);
  if (iVar2 % nObjs != 0) {
    __assert_fail("Vec_WrdSize(p) % nObjs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSim.c"
                  ,0x7b,"void Vec_WrdDoubleSimInfo(Vec_Wrd_t *, int)");
  }
  for (local_24 = 0; local_24 < nObjs; local_24 = local_24 + 1) {
    memcpy(pwVar3 + local_24 * 2 * iVar1,p->pArray + local_24 * iVar1,(long)iVar1 << 3);
  }
  if (p->pArray != (word *)0x0) {
    free(p->pArray);
    p->pArray = (word *)0x0;
  }
  p->pArray = pwVar3;
  iVar1 = iVar1 * 2 * nObjs;
  p->nCap = iVar1;
  p->nSize = iVar1;
  return;
}

Assistant:

void Vec_WrdDoubleSimInfo( Vec_Wrd_t * p, int nObjs )
{
    word * pArray = ABC_CALLOC( word, 2 * Vec_WrdSize(p) );
    int i, nWords = Vec_WrdSize(p) / nObjs;
    assert( Vec_WrdSize(p) % nObjs == 0 );
    for ( i = 0; i < nObjs; i++ )
        memcpy( pArray + 2*i*nWords, p->pArray + i*nWords, sizeof(word) * nWords );
    ABC_FREE( p->pArray ); p->pArray = pArray;
    p->nSize = p->nCap = 2*nWords*nObjs;
}